

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

bool __thiscall
glcts::LayoutBindingProgram::setBindingPoints
          (LayoutBindingProgram *this,StringVector *list,GLint bindingPoint)

{
  GLenum GVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  _Self __tmp;
  StringIntMap locations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,list);
  getUniformLocations((StringIntMap *)&local_58,this,&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  bVar3 = true;
  if (local_58._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var2 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_58._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (*this->m_gl->uniform1i)(p_Var2[2]._M_color,bindingPoint);
      GVar1 = (*this->m_gl->getError)();
      bVar3 = (bool)(bVar3 & GVar1 == 0);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_58);
  return bVar3;
}

Assistant:

virtual bool setBindingPoints(StringVector list, glw::GLint bindingPoint) const
	{
		bool bNoError = true;

		StringIntMap locations = getUniformLocations(list);
		if (!locations.empty())
		{
			for (StringIntMap::iterator it = locations.begin(); it != locations.end(); it++)
			{
				m_gl.uniform1i(it->second, bindingPoint);
				bNoError &= (GL_NO_ERROR == m_gl.getError());
			}
		}
		return bNoError;
	}